

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
PhaseBotsIRCCommand::trigger
          (PhaseBotsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  const_iterator __begin1;
  undefined8 *puVar4;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  basic_string_view<char,_std::char_traits<char>_> rhs_02;
  long lStack_50;
  undefined8 *local_48;
  undefined8 *local_40;
  
  pcVar3 = channel._M_str;
  lVar2 = Jupiter::IRC::Client::getChannel
                    (source,channel._M_len,pcVar3,pcVar3,nick._M_len,nick._M_str);
  if (lVar2 != 0) {
    RenX::getCore();
    Jupiter::IRC::Client::Channel::getType();
    RenX::Core::getServers((int)&local_48);
    puVar4 = local_48;
    if (local_48 == local_40) {
      Jupiter::IRC::Client::sendMessage
                (source,channel._M_len,pcVar3,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
    else {
      for (; puVar4 != local_40; puVar4 = puVar4 + 1) {
        if (parameters._M_len == 0) {
          bVar1 = togglePhasing((Server *)*puVar4);
          lStack_50 = 0x1e - (ulong)bVar1;
          pcVar3 = "Bot phasing has been disabled.";
          if (bVar1) {
            pcVar3 = "Bot phasing has been enabled.";
          }
        }
        else {
          rhs._M_str = "true";
          rhs._M_len = 4;
          bVar1 = jessilib::equalsi<char,char>(parameters,rhs);
          if ((((bVar1) ||
               (rhs_00._M_str = "on", rhs_00._M_len = 2,
               bVar1 = jessilib::equalsi<char,char>(parameters,rhs_00), bVar1)) ||
              (rhs_01._M_str = "start", rhs_01._M_len = 5,
              bVar1 = jessilib::equalsi<char,char>(parameters,rhs_01), bVar1)) ||
             (rhs_02._M_str = "1", rhs_02._M_len = 1,
             bVar1 = jessilib::equalsi<char,char>(parameters,rhs_02), bVar1)) {
            togglePhasing((Server *)*puVar4,true);
            lStack_50 = 0x1d;
            pcVar3 = "Bot phasing has been enabled.";
          }
          else {
            togglePhasing((Server *)*puVar4,false);
            lStack_50 = 0x1e;
            pcVar3 = "Bot phasing has been disabled.";
          }
        }
        RenX::Server::sendMessage(*puVar4,lStack_50,pcVar3);
      }
    }
    std::_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~_Vector_base
              ((_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&local_48);
  }
  return;
}

Assistant:

void PhaseBotsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(chan->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	for (const auto& server : servers) {
		if (parameters.empty()) {
			if (togglePhasing(server)) {
				server->sendMessage("Bot phasing has been enabled."sv);
			}
			else {
				server->sendMessage("Bot phasing has been disabled."sv);
			}
		}
		else if (jessilib::equalsi(parameters, "true"sv) || jessilib::equalsi(parameters, "on"sv)
			|| jessilib::equalsi(parameters, "start"sv) || jessilib::equalsi(parameters, "1"sv)) {
			togglePhasing(server, true);
			server->sendMessage("Bot phasing has been enabled."sv);
		}
		else {
			togglePhasing(server, false);
			server->sendMessage("Bot phasing has been disabled."sv);
		}
	}
}